

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_buffer.cc
# Opt level: O1

bool __thiscall
draco::DecoderBuffer::StartBitDecoding(DecoderBuffer *this,bool decode_size,uint64_t *out_size)

{
  char *pcVar1;
  bool bVar2;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,decode_size) != 0) {
    if (this->bitstream_version_ < 0x202) {
      if (this->data_size_ < this->pos_ + 8) {
        return false;
      }
      *out_size = *(uint64_t *)(this->data_ + this->pos_);
      this->pos_ = this->pos_ + 8;
    }
    else {
      bVar2 = anon_unknown_2::DecodeVarintUnsigned<unsigned_long>(1,out_size,this);
      if (!bVar2) {
        return false;
      }
    }
  }
  this->bit_mode_ = true;
  pcVar1 = this->data_;
  (this->bit_decoder_).bit_offset_ = 0;
  (this->bit_decoder_).bit_buffer_ = (uint8_t *)(pcVar1 + this->pos_);
  (this->bit_decoder_).bit_buffer_end_ = (uint8_t *)(pcVar1 + this->data_size_);
  return true;
}

Assistant:

bool DecoderBuffer::StartBitDecoding(bool decode_size, uint64_t *out_size) {
  if (decode_size) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (bitstream_version_ < DRACO_BITSTREAM_VERSION(2, 2)) {
      if (!Decode(out_size)) {
        return false;
      }
    } else
#endif
    {
      if (!DecodeVarint(out_size, this)) {
        return false;
      }
    }
  }
  bit_mode_ = true;
  bit_decoder_.reset(data_head(), remaining_size());
  return true;
}